

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

bool __thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert_update(tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *this,unsigned_long *key,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
                  time_point now,time_point expire_time,allow a)

{
  bool bVar1;
  reference __in;
  type *ptVar2;
  reference __rhs;
  element *e;
  type *element_idx;
  type *k;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_50;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_48;
  iterator keyed_position;
  allow a_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  unsigned_long *key_local;
  tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point expire_time_local;
  time_point now_local;
  
  keyed_position.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)a;
  expire_time_local = now;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::find((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)(this + 0x48),key);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::end((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)(this + 0x48));
  bVar1 = std::__detail::operator!=(&local_48,&local_50);
  if (bVar1) {
    bVar1 = update_allowed((allow)keyed_position.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                  ._M_cur);
    if (bVar1) {
      do_update(this,(iterator)local_48._M_cur,value,expire_time);
      return true;
    }
    bVar1 = insert_allowed((allow)keyed_position.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                  ._M_cur);
    if (bVar1) {
      __in = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::operator*
                       ((_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>
                         *)&local_48);
      std::get<0ul,unsigned_long_const,unsigned_long>(__in);
      ptVar2 = std::get<1ul,unsigned_long_const,unsigned_long>(__in);
      __rhs = std::
              vector<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
              ::operator[]((vector<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                            *)(this + 0x30),*ptVar2);
      bVar1 = std::chrono::operator>=(&expire_time_local,&__rhs->m_expire_time);
      if (bVar1) {
        do_update(this,(iterator)local_48._M_cur,value,expire_time);
        return true;
      }
    }
  }
  else {
    bVar1 = insert_allowed((allow)keyed_position.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                  ._M_cur);
    if (bVar1) {
      do_insert(this,key,value,expire_time_local,expire_time);
      return true;
    }
  }
  return false;
}

Assistant:

auto do_insert_update(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time,
        allow                                 a) -> bool
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value), expire_time);
                return true;
            }
            else if (insert_allowed(a))
            {
                // If the item has expired and this is INSERT then allow the
                // insert to proceed, this can just be an update in place.
                const auto& [k, element_idx] = *keyed_position;
                element& e                   = m_elements[element_idx];
                if (now >= e.m_expire_time)
                {
                    do_update(keyed_position, std::move(value), expire_time);
                    return true;
                }
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value), now, expire_time);
                return true;
            }
        }
        return false;
    }